

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::Simulator(Simulator *this,IR *ir)

{
  _Rb_tree_header *p_Var1;
  
  std::vector<PCode,_std::allocator<PCode>_>::vector
            ((vector<PCode,_std::allocator<PCode>_> *)this,&ir->ir_);
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<StackSymbol,_std::allocator<StackSymbol>_>::_M_initialize_map
            (&(this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>,0);
  ScopeTree::ScopeTree(&this->tree_);
  p_Var1 = &(this->func_table_)._M_t._M_impl.super__Rb_tree_header;
  (this->func_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->func_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->func_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->func_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->func_table_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->label_table_)._M_t._M_impl.super__Rb_tree_header;
  (this->label_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->label_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->label_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->label_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->label_table_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->eip_ = 0;
  this->inloop_ = 0;
  return;
}

Assistant:

Simulator(const IR &ir) : ir_(ir), eip_(0), inloop_(false) { }